

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_example_json.h
# Opt level: O1

void __thiscall Context<true>::Context(Context<true> *this)

{
  (this->error_ptr)._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  (this->namespace_path).super__Vector_base<Namespace<true>,_std::allocator<Namespace<true>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->namespace_path).super__Vector_base<Namespace<true>,_std::allocator<Namespace<true>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->namespace_path).super__Vector_base<Namespace<true>,_std::allocator<Namespace<true>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->default_state).super_BaseState<true>.name = "Default";
  (this->default_state).super_BaseState<true>._vptr_BaseState = (_func_int **)&PTR_Null_002cbab0;
  (this->label_state).super_BaseState<true>.name = "Label";
  (this->label_state).super_BaseState<true>._vptr_BaseState = (_func_int **)&PTR_Null_002cbb98;
  (this->label_object_state).super_BaseState<true>.name = "LabelObject";
  (this->label_object_state).super_BaseState<true>._vptr_BaseState =
       (_func_int **)&PTR_Null_002cbc10;
  (this->label_single_property_state).super_BaseState<true>.name = "LabelSingleProperty";
  (this->label_single_property_state).super_BaseState<true>._vptr_BaseState =
       (_func_int **)&PTR_Null_002cbc88;
  (this->label_index_state).super_BaseState<true>.name = "LabelIndex";
  (this->label_index_state).super_BaseState<true>._vptr_BaseState = (_func_int **)&PTR_Null_002cbd00
  ;
  (this->label_index_state).index = -1;
  (this->text_state).super_BaseState<true>.name = "text";
  (this->text_state).super_BaseState<true>._vptr_BaseState = (_func_int **)&PTR_Null_002cbd78;
  (this->tag_state).super_BaseState<true>._vptr_BaseState = (_func_int **)&PTR_Null_002cbb38;
  (this->tag_state).super_BaseState<true>.name = "tag";
  (this->tag_state).super_BaseState<true>._vptr_BaseState = (_func_int **)&PTR_Null_002cbdf0;
  (this->multi_state).super_BaseState<true>.name = "Multi";
  (this->multi_state).super_BaseState<true>._vptr_BaseState = (_func_int **)&PTR_Null_002cbe68;
  (this->ignore_state).super_BaseState<true>.name = "Ignore";
  (this->ignore_state).super_BaseState<true>._vptr_BaseState = (_func_int **)&PTR_Null_002cbee0;
  (this->array_state).super_BaseState<true>.name = "Array";
  (this->array_state).super_BaseState<true>._vptr_BaseState = (_func_int **)&PTR_Null_002cbf58;
  (this->decision_service_state).super_BaseState<true>.name = "DecisionService";
  (this->decision_service_state).super_BaseState<true>._vptr_BaseState =
       (_func_int **)&PTR_Null_002cbfd0;
  (this->array_float_state).super_BaseState<true>.name = "ArrayToVectorState";
  (this->array_float_state).super_BaseState<true>._vptr_BaseState = (_func_int **)&PTR_Null_002cc048
  ;
  (this->array_uint_state).super_BaseState<true>.name = "ArrayToVectorState";
  (this->array_uint_state).super_BaseState<true>._vptr_BaseState = (_func_int **)&PTR_Null_002cc0c0;
  (this->string_state).super_BaseState<true>.name = "StringToStringState";
  (this->string_state).super_BaseState<true>._vptr_BaseState = (_func_int **)&PTR_Null_002cc138;
  (this->float_state).super_BaseState<true>._vptr_BaseState = (_func_int **)&PTR_Null_002cbb38;
  (this->float_state).super_BaseState<true>.name = "FloatToFloatState";
  (this->float_state).super_BaseState<true>._vptr_BaseState = (_func_int **)&PTR_Null_002cc1b0;
  (this->bool_state).super_BaseState<true>._vptr_BaseState = (_func_int **)&PTR_Null_002cbb38;
  (this->bool_state).super_BaseState<true>.name = "BoolToBoolState";
  (this->bool_state).super_BaseState<true>._vptr_BaseState = (_func_int **)&PTR_Null_002cc228;
  this->current_state = &(this->default_state).super_BaseState<true>;
  this->root_state = &(this->default_state).super_BaseState<true>;
  return;
}

Assistant:

Context()
  {
    current_state = &default_state;
    root_state = &default_state;
  }